

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lambda_functions.hpp
# Opt level: O2

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::ListLambdaBindData::Copy(ListLambdaBindData *this)

{
  __uniq_ptr_impl<duckdb::ListLambdaBindData,_std::default_delete<duckdb::ListLambdaBindData>_>
  _Var1;
  pointer pEVar2;
  long in_RSI;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_20;
  __uniq_ptr_impl<duckdb::ListLambdaBindData,_std::default_delete<duckdb::ListLambdaBindData>_>
  local_18;
  
  if (*(long *)(in_RSI + 0x20) == 0) {
    local_20._M_head_impl = (Expression *)0x0;
  }
  else {
    pEVar2 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                         *)(in_RSI + 0x20));
    (**(code **)(*(long *)pEVar2 + 0x88))(&local_20,pEVar2);
  }
  make_uniq<duckdb::ListLambdaBindData,duckdb::LogicalType_const&,duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,bool_const&,bool_const&>
            ((duckdb *)&local_18,(LogicalType *)(in_RSI + 8),
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             &local_20,(bool *)(in_RSI + 0x28),(bool *)(in_RSI + 0x29));
  _Var1._M_t.
  super__Tuple_impl<0UL,_duckdb::ListLambdaBindData_*,_std::default_delete<duckdb::ListLambdaBindData>_>
  .super__Head_base<0UL,_duckdb::ListLambdaBindData_*,_false>._M_head_impl =
       local_18._M_t.
       super__Tuple_impl<0UL,_duckdb::ListLambdaBindData_*,_std::default_delete<duckdb::ListLambdaBindData>_>
       .super__Head_base<0UL,_duckdb::ListLambdaBindData_*,_false>._M_head_impl;
  local_18._M_t.
  super__Tuple_impl<0UL,_duckdb::ListLambdaBindData_*,_std::default_delete<duckdb::ListLambdaBindData>_>
  .super__Head_base<0UL,_duckdb::ListLambdaBindData_*,_false>._M_head_impl =
       (tuple<duckdb::ListLambdaBindData_*,_std::default_delete<duckdb::ListLambdaBindData>_>)
       (_Tuple_impl<0UL,_duckdb::ListLambdaBindData_*,_std::default_delete<duckdb::ListLambdaBindData>_>
        )0x0;
  *(tuple<duckdb::ListLambdaBindData_*,_std::default_delete<duckdb::ListLambdaBindData>_> *)this =
       _Var1._M_t.
       super__Tuple_impl<0UL,_duckdb::ListLambdaBindData_*,_std::default_delete<duckdb::ListLambdaBindData>_>
       .super__Head_base<0UL,_duckdb::ListLambdaBindData_*,_false>._M_head_impl;
  std::unique_ptr<duckdb::ListLambdaBindData,_std::default_delete<duckdb::ListLambdaBindData>_>::
  ~unique_ptr((unique_ptr<duckdb::ListLambdaBindData,_std::default_delete<duckdb::ListLambdaBindData>_>
               *)&local_18);
  if (local_20._M_head_impl != (Expression *)0x0) {
    (**(code **)(*(long *)local_20._M_head_impl + 8))();
  }
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
}

Assistant:

unique_ptr<FunctionData> Copy() const override {
		auto lambda_expr_copy = lambda_expr ? lambda_expr->Copy() : nullptr;
		return make_uniq<ListLambdaBindData>(return_type, std::move(lambda_expr_copy), has_index, has_initial);
	}